

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *other)

{
  ulong uVar1;
  undefined1 *in_RSI;
  json_value *in_RDI;
  binary_t *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 check_parents;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffb0;
  json_value local_48;
  json_value local_40;
  json_value local_38;
  json_value local_30;
  json_value local_28;
  json_value local_20;
  json_value local_18;
  undefined1 *local_10;
  
  in_RDI->boolean = (boolean_t)*in_RSI;
  in_RDI[1].object = (object_t *)0x0;
  local_10 = in_RSI;
  assert_invariant(in_stack_ffffffffffffffb0,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  uVar1 = (ulong)in_RDI->boolean;
  switch(uVar1) {
  case 0:
  case 9:
    break;
  case 1:
    json_value::json_value(in_RDI,(object_t *)in_stack_ffffffffffffff98);
    in_RDI[1] = local_18;
    break;
  case 2:
    json_value::json_value(in_RDI,(array_t *)in_stack_ffffffffffffff98);
    in_RDI[1] = local_20;
    break;
  case 3:
    json_value::json_value(in_RDI,(string_t *)in_stack_ffffffffffffff98);
    in_RDI[1] = local_28;
    break;
  case 4:
    json_value::json_value((json_value *)&local_30.boolean,(boolean_t)(local_10[8] & 1));
    in_RDI[1] = local_30;
    break;
  case 5:
    json_value::json_value((json_value *)&local_38.boolean,*(number_integer_t *)(local_10 + 8));
    in_RDI[1] = local_38;
    break;
  case 6:
    json_value::json_value((json_value *)&local_40.boolean,*(number_unsigned_t *)(local_10 + 8));
    in_RDI[1] = local_40;
    break;
  case 7:
    json_value::json_value((json_value *)&local_48.boolean,*(number_float_t *)(local_10 + 8));
    in_RDI[1] = local_48;
    break;
  case 8:
    json_value::json_value(in_RDI,in_stack_ffffffffffffff98);
    in_RDI[1].object = (object_t *)in_stack_ffffffffffffffb0;
  }
  check_parents = (undefined1)(uVar1 >> 0x38);
  set_parents((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)in_RDI);
  assert_invariant(in_stack_ffffffffffffffb0,(bool)check_parents);
  return;
}

Assistant:

basic_json(const basic_json& other)
        : m_type(other.m_type)
    {
        // check of passed value is valid
        other.assert_invariant();

        switch (m_type)
        {
            case value_t::object:
            {
                m_value = *other.m_value.object;
                break;
            }

            case value_t::array:
            {
                m_value = *other.m_value.array;
                break;
            }

            case value_t::string:
            {
                m_value = *other.m_value.string;
                break;
            }

            case value_t::boolean:
            {
                m_value = other.m_value.boolean;
                break;
            }

            case value_t::number_integer:
            {
                m_value = other.m_value.number_integer;
                break;
            }

            case value_t::number_unsigned:
            {
                m_value = other.m_value.number_unsigned;
                break;
            }

            case value_t::number_float:
            {
                m_value = other.m_value.number_float;
                break;
            }

            case value_t::binary:
            {
                m_value = *other.m_value.binary;
                break;
            }

            case value_t::null:
            case value_t::discarded:
            default:
                break;
        }

        set_parents();
        assert_invariant();
    }